

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec.h
# Opt level: O1

void __thiscall vec<WellFounded>::growTo(vec<WellFounded> *this,uint size)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  
  if (this->sz < size) {
    reserve(this,size);
    uVar1 = this->sz;
    if (uVar1 < size) {
      lVar2 = (ulong)uVar1 * 0x230;
      lVar3 = (ulong)size - (ulong)uVar1;
      do {
        WellFounded::WellFounded
                  ((WellFounded *)((long)&(this->data->super_Propagator)._vptr_Propagator + lVar2));
        lVar2 = lVar2 + 0x230;
        lVar3 = lVar3 + -1;
      } while (lVar3 != 0);
    }
    this->sz = size;
  }
  return;
}

Assistant:

void growTo(unsigned int size) {
		if (size <= sz) {
			return;
		}
		reserve(size);
		for (unsigned int i = sz; i < size; i++) {
			new (&data[i]) T();
		}
		sz = size;
	}